

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_address.cpp
# Opt level: O0

int CfdParseConfidentialAddress
              (void *handle,char *confidential_address,char **address,char **confidential_key,
              int *network_type)

{
  bool bVar1;
  NetType network_type_00;
  int iVar2;
  undefined8 uVar3;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  char *in_RSI;
  int *in_R8;
  CfdException *except;
  exception *std_except;
  Address addr;
  ElementsConfidentialAddress confidential_addr;
  ElementsAddressFactory factory;
  char *work_confidential_key;
  char *work_address;
  ElementsConfidentialAddress *in_stack_fffffffffffff990;
  string *in_stack_fffffffffffff9a0;
  ElementsAddressFactory *in_stack_fffffffffffff9a8;
  CfdError error_code;
  undefined4 in_stack_fffffffffffff9b0;
  undefined4 in_stack_fffffffffffff9b4;
  ElementsAddressFactory *in_stack_fffffffffffff9c0;
  allocator *paVar4;
  string *in_stack_fffffffffffff9f0;
  string local_5f8;
  string local_5d8;
  Address local_5b8;
  allocator local_439;
  string local_438 [32];
  ElementsConfidentialAddress local_418;
  ElementsConfidentialAddress local_268;
  undefined1 local_8a;
  allocator local_89;
  string local_88 [32];
  CfdSourceLocation local_68;
  char *local_40;
  char *local_38;
  int *local_30;
  undefined8 *local_28;
  undefined8 *local_20;
  char *local_18;
  int local_4;
  
  local_38 = (char *)0x0;
  local_40 = (char *)0x0;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (!bVar1) {
    cfd::ElementsAddressFactory::ElementsAddressFactory(in_stack_fffffffffffff9c0);
    cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(&local_268);
    paVar4 = &local_439;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_438,local_18,paVar4);
    cfd::ElementsAddressFactory::GetConfidentialAddress
              (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
    cfd::core::ElementsConfidentialAddress::operator=(&local_268,&local_418);
    cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(in_stack_fffffffffffff990);
    std::__cxx11::string::~string(local_438);
    std::allocator<char>::~allocator((allocator<char> *)&local_439);
    cfd::core::ElementsConfidentialAddress::GetUnblindedAddress(&local_5b8,&local_268);
    if (local_30 != (int *)0x0) {
      network_type_00 = cfd::core::Address::GetNetType(&local_5b8);
      iVar2 = cfd::capi::ConvertFromCfdNetType(network_type_00);
      *local_30 = iVar2;
    }
    if (local_20 != (undefined8 *)0x0) {
      cfd::core::Address::GetAddress_abi_cxx11_(&local_5d8,&local_5b8);
      local_38 = cfd::capi::CreateString(in_stack_fffffffffffff9f0);
      std::__cxx11::string::~string((string *)&local_5d8);
    }
    if (local_28 != (undefined8 *)0x0) {
      cfd::core::ElementsConfidentialAddress::GetConfidentialKey
                ((ConfidentialKey *)&stack0xfffffffffffff9f0,&local_268);
      cfd::core::Pubkey::GetHex_abi_cxx11_(&local_5f8,(Pubkey *)&stack0xfffffffffffff9f0);
      local_40 = cfd::capi::CreateString(in_stack_fffffffffffff9f0);
      std::__cxx11::string::~string((string *)&local_5f8);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x5a1270);
    }
    if (local_38 != (char *)0x0) {
      *local_20 = local_38;
    }
    if (local_40 != (char *)0x0) {
      *local_28 = local_40;
    }
    local_4 = 0;
    cfd::core::Address::~Address(&in_stack_fffffffffffff990->unblinded_address_);
    cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(in_stack_fffffffffffff990);
    cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x5a1323);
    return local_4;
  }
  local_68.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_address.cpp"
               ,0x2f);
  error_code = (CfdError)((ulong)in_stack_fffffffffffff9a8 >> 0x20);
  local_68.filename = local_68.filename + 1;
  local_68.line = 0x77;
  local_68.funcname = "CfdParseConfidentialAddress";
  cfd::core::logger::warn<>(&local_68,"confidential address is null or empty.");
  local_8a = 1;
  uVar3 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_88,"Failed to parameter. confidential address is null or empty.",&local_89);
  cfd::core::CfdException::CfdException
            ((CfdException *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
             error_code,in_stack_fffffffffffff9a0);
  local_8a = 0;
  __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdParseConfidentialAddress(
    void* handle, const char* confidential_address, char** address,
    char** confidential_key, int* network_type) {
  char* work_address = nullptr;
  char* work_confidential_key = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(confidential_address)) {
      warn(CFD_LOG_SOURCE, "confidential address is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. confidential address is null or empty.");
    }

    ElementsAddressFactory factory;
    ElementsConfidentialAddress confidential_addr;
    confidential_addr = factory.GetConfidentialAddress(confidential_address);
    Address addr = confidential_addr.GetUnblindedAddress();
    if (network_type != nullptr) {
      // convert to c_network_type
      *network_type = ConvertFromCfdNetType(addr.GetNetType());
    }
    if (address != nullptr) {
      work_address = CreateString(addr.GetAddress());
    }
    if (confidential_key != nullptr) {
      work_confidential_key =
          CreateString(confidential_addr.GetConfidentialKey().GetHex());
    }

    if (work_address != nullptr) *address = work_address;
    if (work_confidential_key != nullptr)
      *confidential_key = work_confidential_key;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(&work_address, &work_confidential_key);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(&work_address, &work_confidential_key);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(&work_address, &work_confidential_key);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}